

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
asl::Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::Array
          (Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *this,KeyVal *p,int n)

{
  int *piVar1;
  KeyVal *pKVar2;
  long lVar3;
  KeyVal *pKVar4;
  long lVar5;
  char *b;
  Array<asl::Map<asl::String,_asl::String>::KeyVal> *this_00;
  
  alloc(this,n);
  if (0 < n) {
    lVar5 = 0;
    do {
      if (*(int *)((long)&(p->key)._size + lVar5) == 0) {
        b = (p->key).field_2._space + lVar5;
      }
      else {
        b = *(char **)((long)&(p->key).field_2 + lVar5);
      }
      pKVar2 = this->_a;
      String::assign((String *)((long)&(pKVar2->key)._size + lVar5),b,
                     *(int *)((long)&(p->key)._len + lVar5));
      lVar3 = *(long *)((long)&(pKVar2->value).super_Map<asl::String,_asl::String>.a._a + lVar5);
      if (lVar3 != *(long *)((long)&(p->value).super_Map<asl::String,_asl::String>.a._a + lVar5)) {
        this_00 = (Array<asl::Map<asl::String,_asl::String>::KeyVal> *)
                  ((long)&(pKVar2->value).super_Map<asl::String,_asl::String>.a._a + lVar5);
        LOCK();
        piVar1 = (int *)(lVar3 + -8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          Array<asl::Map<asl::String,_asl::String>::KeyVal>::free(this_00,b);
        }
        pKVar4 = *(KeyVal **)((long)&(p->value).super_Map<asl::String,_asl::String>.a._a + lVar5);
        this_00->_a = pKVar4;
        LOCK();
        piVar1 = (int *)((long)&pKVar4[-1].value.field_2 + 8);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      lVar5 = lVar5 + 0x20;
    } while ((ulong)(uint)n << 5 != lVar5);
  }
  return;
}

Assistant:

ASL_EXPLICIT Array(const T* p, int n) { alloc(n); for (int i = 0; i < n; i++) _a[i] = p[i]; }